

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::Engine(Engine *this)

{
  rep rVar1;
  long lVar2;
  BranchGroup *this_00;
  MIP *this_01;
  long lVar3;
  long lVar4;
  
  this->problem = (Problem *)0x0;
  this->opt_var = (IntVar *)0x0;
  (this->vars).sz = 0;
  (this->vars).cap = 0;
  (this->vars).data = (IntVar **)0x0;
  (this->outputs).sz = 0;
  (this->outputs).cap = 0;
  (this->outputs).data = (Branching **)0x0;
  (this->propagators).sz = 0;
  (this->propagators).cap = 0;
  (this->propagators).data = (Propagator **)0x0;
  (this->pseudo_props).sz = 0;
  (this->pseudo_props).cap = 0;
  (this->pseudo_props).data = (PseudoProp **)0x0;
  (this->checkers).sz = 0;
  (this->checkers).cap = 0;
  (this->checkers).data = (Checker **)0x0;
  (this->assumptions).sz = 0;
  (this->assumptions).cap = 0;
  (this->assumptions).data = (int *)0x0;
  this->finished_init = false;
  this->best_sol = -1;
  this->time_out = (duration)0x0;
  (this->v_queue).sz = 0;
  (this->v_queue).cap = 0;
  *(undefined1 (*) [16])&(this->v_queue).data = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->p_queue).data = (undefined1  [16])0x0;
  (this->dec_info).sz = 0;
  (this->dec_info).cap = 0;
  (this->dec_info).data = (DecInfo *)0x0;
  (this->trail).sz = 0;
  (this->trail).cap = 0;
  (this->trail).data = (TrailElem *)0x0;
  (this->trail_lim).sz = 0;
  (this->trail_lim).cap = 0;
  (this->trail_lim).data = (int *)0x0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_time).__d.__r = rVar1;
  (this->opt_time).__r = 0;
  this->conflicts = 0;
  this->nodes = 1;
  this->propagations = 0;
  this->solutions = 0;
  this->next_simp_db = 0;
  this->output_stream = (ostream *)&std::cout;
  (this->solution_callback).super__Function_base._M_functor = (_Any_data)0x0;
  *(undefined1 (*) [16])&(this->solution_callback).super__Function_base._M_manager =
       (undefined1  [16])0x0;
  (this->rnd)._M_x = 1;
  vec<vec<Propagator_*>_>::growTo(&this->p_queue,6);
  lVar3 = 0;
  lVar4 = 1;
  lVar2 = 0;
  do {
    *(long *)((long)bit + lVar2) = 1L << lVar3;
    *(long *)((long)bit + lVar2 + 8) = 1L << lVar4;
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 2;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x200);
  this_00 = (BranchGroup *)operator_new(0x38);
  BranchGroup::BranchGroup(this_00,VAR_INORDER,false);
  this->branching = this_00;
  this_01 = (MIP *)operator_new(0x118);
  MIP::MIP(this_01);
  mip = this_01;
  return;
}

Assistant:

Engine::Engine()
		: start_time(chuffed_clock::now()),
			opt_time(duration::zero()),

			output_stream(&std::cout),
			solution_callback(nullptr)
#ifdef HAS_VAR_IMPACT
			,
			last_int(nullptr)
#endif
{
	p_queue.growTo(num_queues);
	for (int i = 0; i < 64; i++) {
		bit[i] = ((long long)1 << i);
	}
	branching = new BranchGroup();
	mip = new MIP();
}